

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderIndexingCase::ShaderIndexingCase
          (ShaderIndexingCase *this,Context *context,char *name,char *description,bool isVertexCase,
          DataType varType,ShaderEvalFunc evalFunc,char *vertShaderSource,char *fragShaderSource)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  DataType varType_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderIndexingCase *this_local;
  
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  ctxInfo = gles3::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderIndexingCase_0328a1e0;
  this->m_varType = varType;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vertShaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragShaderSource);
  return;
}

Assistant:

ShaderIndexingCase::ShaderIndexingCase (Context& context, const char* name, const char* description, bool isVertexCase, DataType varType, ShaderEvalFunc evalFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
{
	m_varType			= varType;
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}